

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_strategies.cpp
# Opt level: O3

void __thiscall
Clasp::DynamicLimit::DynamicLimit
          (DynamicLimit *this,float k,uint32 size,Type fast,Keep keep,Type slow,uint32 slowSize,
          uint32 adjustLim)

{
  if (slow == avg_sma || slowSize != 0) {
    Global::Global(&this->global_,slow,slowSize);
    if (size == 0) {
      Potassco::fail(-2,"uint32 Clasp::verifySize(uint32)",0xb5,"size != 0","size must be > 0",0);
    }
  }
  else {
    if (size == 0) {
      Potassco::fail(-2,"uint32 Clasp::verifySize(uint32)",0xb5,"size != 0","size must be > 0",0);
    }
    Global::Global(&this->global_,slow,size * 200);
  }
  MovingAvg::MovingAvg(&this->avg_,size,fast);
  this->num_ = 0;
  this->keep_ = keep;
  (this->adjust).limit = 0;
  (this->adjust).restarts = 0;
  (this->adjust).samples = 0;
  (this->adjust).rk = 0.0;
  (this->adjust).limit = adjustLim;
  (this->adjust).rk = k;
  (this->adjust).type = lbd_limit;
  return;
}

Assistant:

DynamicLimit::DynamicLimit(float k, uint32 size, MovingAvg::Type fast, Keep keep, MovingAvg::Type slow, uint32 slowSize, uint32 adjustLim)
	: global_(slow, slowSize || slow == MovingAvg::avg_sma ? slowSize : 200 * verifySize(size))
	, avg_(verifySize(size), fast)
	, num_(0)
	, keep_(keep) {
	resetAdjust(k, lbd_limit, adjustLim);
}